

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O0

bool OpenMD::invertMatrix<OpenMD::DynamicRectMatrix<double>>
               (DynamicRectMatrix<double> *A,DynamicRectMatrix<double> *AI,uint size,int *tmp1Size,
               ElemPoinerType tmp2Size)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  int *in_RCX;
  uint in_EDX;
  DynamicRectMatrix<double> *in_RSI;
  DynamicRectMatrix<double> *in_RDI;
  ElemPoinerType in_R8;
  ElemPoinerType in_stack_00000010;
  int in_stack_0000001c;
  uint j;
  uint i;
  uint local_38;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar2 = DynamicRectMatrix<double>::getNRow(in_RDI);
  uVar3 = DynamicRectMatrix<double>::getNCol(in_RDI);
  if (uVar2 == uVar3) {
    uVar2 = DynamicRectMatrix<double>::getNRow(in_RDI);
    uVar3 = DynamicRectMatrix<double>::getNRow(in_RSI);
    if (uVar2 == uVar3) {
      uVar2 = DynamicRectMatrix<double>::getNCol(in_RDI);
      uVar3 = DynamicRectMatrix<double>::getNCol(in_RSI);
      if ((uVar2 == uVar3) && (uVar2 = DynamicRectMatrix<double>::getNRow(in_RDI), uVar2 == in_EDX))
      {
        iVar4 = LUFactorLinearSystem<OpenMD::DynamicRectMatrix<double>>
                          ((DynamicRectMatrix<double> *)tmp2Size,_j,in_stack_0000001c,
                           in_stack_00000010);
        if (iVar4 == 0) {
          return false;
        }
        for (local_38 = 0; local_38 < in_EDX; local_38 = local_38 + 1) {
          for (uVar2 = 0; uVar2 < in_EDX; uVar2 = uVar2 + 1) {
            in_R8[uVar2] = 0.0;
          }
          in_R8[local_38] = 1.0;
          LUSolveLinearSystem<OpenMD::DynamicRectMatrix<double>>
                    ((DynamicRectMatrix<double> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,
                     in_R8,uVar2);
          for (uVar2 = 0; uVar2 < in_EDX; uVar2 = uVar2 + 1) {
            dVar1 = in_R8[uVar2];
            pdVar5 = DynamicRectMatrix<double>::operator()(in_RSI,uVar2,local_38);
            *pdVar5 = dVar1;
          }
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool invertMatrix(MatrixType& A, MatrixType& AI, unsigned int size,
                    int* tmp1Size,
                    typename MatrixType::ElemPoinerType tmp2Size) {
    if (A.getNRow() != A.getNCol() || A.getNRow() != AI.getNRow() ||
        A.getNCol() != AI.getNCol() || A.getNRow() != size) {
      return false;
    }

    unsigned int i, j;

    //
    // Factor matrix; then begin solving for inverse one column at a time.
    // Note: tmp1Size returned value is used later, tmp2Size is just working
    // memory whose values are not used in LUSolveLinearSystem
    //
    if (LUFactorLinearSystem(A, tmp1Size, size, tmp2Size) == 0) {
      return false;
    }

    for (j = 0; j < size; ++j) {
      for (i = 0; i < size; ++i) {
        tmp2Size[i] = 0.0;
      }
      tmp2Size[j] = 1.0;

      LUSolveLinearSystem(A, tmp1Size, tmp2Size, size);

      for (i = 0; i < size; i++) {
        AI(i, j) = tmp2Size[i];
      }
    }

    return true;
  }